

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall soplex::SLUFactor<double>::freeAll(SLUFactor<double> *this)

{
  bool bVar1;
  long in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x50) != 0) {
    spx_free<int*>((int **)0x24e4e0);
  }
  if (*(long *)(in_RDI + 0x48) != 0) {
    spx_free<int*>((int **)0x24e4fe);
  }
  if (*(long *)(in_RDI + 0x60) != 0) {
    spx_free<int*>((int **)0x24e520);
  }
  if (*(long *)(in_RDI + 0x58) != 0) {
    spx_free<int*>((int **)0x24e53e);
  }
  if (*(long *)(in_RDI + 0x120) != 0) {
    spx_free<soplex::CLUFactor<double>::Dring*>((Dring **)0x24e566);
  }
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(unaff_retaddr);
  if (!bVar1) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x24e59c);
  }
  if (*(long *)(in_RDI + 0x148) != 0) {
    spx_free<int*>((int **)0x24e5c4);
  }
  if (*(long *)(in_RDI + 0x150) != 0) {
    spx_free<int*>((int **)0x24e5ec);
  }
  if (*(long *)(in_RDI + 0x158) != 0) {
    spx_free<int*>((int **)0x24e614);
  }
  if (*(long *)(in_RDI + 0x160) != 0) {
    spx_free<int*>((int **)0x24e63c);
  }
  if (*(long *)(in_RDI + 0x180) != 0) {
    spx_free<soplex::CLUFactor<double>::Dring*>((Dring **)0x24e668);
  }
  if (*(long *)(in_RDI + 400) != 0) {
    spx_free<int*>((int **)0x24e694);
  }
  if (*(long *)(in_RDI + 0x1b0) != 0) {
    spx_free<int*>((int **)0x24e6c0);
  }
  if (*(long *)(in_RDI + 0x1b8) != 0) {
    spx_free<int*>((int **)0x24e6ec);
  }
  if (*(long *)(in_RDI + 0x1c0) != 0) {
    spx_free<int*>((int **)0x24e718);
  }
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(unaff_retaddr);
  if (!bVar1) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x24e748);
  }
  if (*(long *)(in_RDI + 0x88) != 0) {
    spx_free<int*>((int **)0x24e76d);
  }
  if (*(long *)(in_RDI + 0xa0) != 0) {
    spx_free<int*>((int **)0x24e792);
  }
  if (*(long *)(in_RDI + 0xa8) != 0) {
    spx_free<int*>((int **)0x24e7b7);
  }
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(unaff_retaddr);
  if (!bVar1) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x24e7f5);
  }
  if (*(long *)(in_RDI + 0xd0) != 0) {
    spx_free<int*>((int **)0x24e81a);
  }
  if (*(long *)(in_RDI + 0xd8) != 0) {
    spx_free<int*>((int **)0x24e83f);
  }
  if (*(long *)(in_RDI + 0xe0) != 0) {
    spx_free<int*>((int **)0x24e864);
  }
  if (*(long *)(in_RDI + 0xe8) != 0) {
    spx_free<int*>((int **)0x24e88c);
  }
  if (*(long *)(in_RDI + 0x388) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x388))();
    spx_free<soplex::Timer*>((Timer **)0x24e8bd);
  }
  if (*(long *)(in_RDI + 0x1d0) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x1d0))();
    spx_free<soplex::Timer*>((Timer **)0x24e8f2);
  }
  return;
}

Assistant:

void SLUFactor<R>::freeAll()
{

   if(this->row.perm)
      spx_free(this->row.perm);

   if(this->row.orig)
      spx_free(this->row.orig);

   if(this->col.perm)
      spx_free(this->col.perm);

   if(this->col.orig)
      spx_free(this->col.orig);

   if(this->u.row.elem)
      spx_free(this->u.row.elem);

   if(!this->u.row.val.empty())
      this->u.row.val.clear();

   if(this->u.row.idx)
      spx_free(this->u.row.idx);

   if(this->u.row.start)
      spx_free(this->u.row.start);

   if(this->u.row.len)
      spx_free(this->u.row.len);

   if(this->u.row.max)
      spx_free(this->u.row.max);

   if(this->u.col.elem)
      spx_free(this->u.col.elem);

   if(this->u.col.idx)
      spx_free(this->u.col.idx);

   if(this->u.col.start)
      spx_free(this->u.col.start);

   if(this->u.col.len)
      spx_free(this->u.col.len);

   if(this->u.col.max)
      spx_free(this->u.col.max);

   if(!this->l.val.empty())
      this->l.val.clear();

   if(this->l.idx)
      spx_free(this->l.idx);

   if(this->l.start)
      spx_free(this->l.start);

   if(this->l.row)
      spx_free(this->l.row);


   if(!this->u.col.val.empty())
      this->u.col.val.clear();

   if(this->l.ridx)
      spx_free(this->l.ridx);

   if(this->l.rbeg)
      spx_free(this->l.rbeg);

   if(this->l.rorig)
      spx_free(this->l.rorig);

   if(this->l.rperm)
      spx_free(this->l.rperm);

   if(solveTime)
   {
      solveTime->~Timer();
      spx_free(solveTime);
   }

   if(this->factorTime)
   {
      this->factorTime->~Timer();
      spx_free(this->factorTime);
   }
}